

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

errr finish_parse_feat(parser *p)

{
  _Bool _Var1;
  char *pcVar2;
  uint16_t uVar3;
  long lVar4;
  
  lVar4 = 0;
  uVar3 = 0;
  do {
    _Var1 = flag_has_dbg(f_info->flags + lVar4,4,0x15,"f_info[fidx].flags","TF_SHOP");
    if (_Var1) {
      uVar3 = uVar3 + 1;
      f_info->flags[lVar4 + -2] = (bitflag)uVar3;
    }
    if (*(char **)(f_info->flags + lVar4 + 0x35) != (char *)0x0) {
      _Var1 = suffix(*(char **)(f_info->flags + lVar4 + 0x35)," ");
      if (!_Var1) {
        pcVar2 = string_append(*(char **)(f_info->flags + lVar4 + 0x35)," ");
        *(char **)(f_info->flags + lVar4 + 0x35) = pcVar2;
      }
    }
    if (*(char **)(f_info->flags + lVar4 + 0x3d) != (char *)0x0) {
      _Var1 = suffix(*(char **)(f_info->flags + lVar4 + 0x3d)," ");
      if (!_Var1) {
        pcVar2 = string_append(*(char **)(f_info->flags + lVar4 + 0x3d)," ");
        *(char **)(f_info->flags + lVar4 + 0x3d) = pcVar2;
      }
    }
    lVar4 = lVar4 + 0x70;
  } while (lVar4 != 0xaf0);
  z_info->store_max = uVar3;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_feat(struct parser *p) {
	int shop_idx = 0, fidx;

	for (fidx = 0; fidx < FEAT_MAX; ++fidx) {
		/*
		 * Assign shop index based on the order within the other
		 * terrain.
		 */
		if (tf_has(f_info[fidx].flags, TF_SHOP)) {
			f_info[fidx].shopnum = ++shop_idx;
		}
		/*
		 * Ensure the prefixes and prepositions end with a space for
		 * ease of use with the targeting code.
		 */
		if (f_info[fidx].look_prefix && !suffix(
				f_info[fidx].look_prefix, " ")) {
			f_info[fidx].look_prefix = string_append(
				f_info[fidx].look_prefix, " ");
		}
		if (f_info[fidx].look_in_preposition && !suffix(
				f_info[fidx].look_in_preposition, " ")) {
			f_info[fidx].look_in_preposition =
				string_append(f_info[fidx].look_in_preposition,
				" ");
		}
	}
	z_info->store_max = shop_idx;

	parser_destroy(p);
	return 0;
}